

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O0

Index wasm::Bits::getEffectiveShifts(Expression *expr)

{
  bool bVar1;
  Index amount_00;
  int64_t iVar2;
  Type local_40;
  BasicType local_34;
  Type local_30;
  BasicType local_24;
  Const *local_20;
  Const *amount;
  Expression *expr_local;
  
  amount = (Const *)expr;
  local_20 = Expression::cast<wasm::Const>(expr);
  local_24 = i32;
  bVar1 = wasm::Type::operator==
                    (&(local_20->super_SpecificExpression<(wasm::Expression::Id)14>).
                      super_Expression.type,&local_24);
  if (bVar1) {
    amount_00 = wasm::Literal::geti32(&local_20->value);
    wasm::Type::Type(&local_30,i32);
    expr_local._4_4_ = getEffectiveShifts(amount_00,local_30);
  }
  else {
    local_34 = i64;
    bVar1 = wasm::Type::operator==
                      (&(local_20->super_SpecificExpression<(wasm::Expression::Id)14>).
                        super_Expression.type,&local_34);
    if (!bVar1) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                         ,0x4a);
    }
    iVar2 = wasm::Literal::geti64(&local_20->value);
    wasm::Type::Type(&local_40,i64);
    expr_local._4_4_ = getEffectiveShifts((Index)iVar2,local_40);
  }
  return expr_local._4_4_;
}

Assistant:

inline Index getEffectiveShifts(Expression* expr) {
  auto* amount = expr->cast<Const>();
  if (amount->type == Type::i32) {
    return getEffectiveShifts(amount->value.geti32(), Type::i32);
  } else if (amount->type == Type::i64) {
    return getEffectiveShifts(amount->value.geti64(), Type::i64);
  }
  WASM_UNREACHABLE("unexpected type");
}